

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Medals.cpp
# Opt level: O0

void addNoob(PlayerInfo *player,int amount)

{
  bool bVar1;
  Config *pCVar2;
  string *this;
  undefined8 uVar3;
  unsigned_long uVar4;
  char *in_RCX;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  string local_68;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  __sv_type local_38;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  int local_14;
  PlayerInfo *pPStack_10;
  int amount_local;
  PlayerInfo *player_local;
  
  local_14 = amount;
  pPStack_10 = player;
  local_28 = sv("Player",6);
  rhs._M_str = in_RCX;
  rhs._M_len = (size_t)local_28._M_str;
  bVar1 = jessilib::starts_withi<char,char>
                    ((jessilib *)&player->uuid,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_28._M_len,rhs);
  if ((!bVar1) && ((pPStack_10->isBot & 1U) == 0)) {
    pCVar2 = &pPStack_10->varData;
    this = (string *)Jupiter::Plugin::getName_abi_cxx11_();
    local_38 = std::__cxx11::string::operator_cast_to_basic_string_view(this);
    uVar3 = Jupiter::Config::operator[](pCVar2,local_38._M_len,local_38._M_str);
    local_48 = sv("Noobs",5);
    uVar4 = getNoobs(pPStack_10);
    string_printf_abi_cxx11_(&local_68,"%u",uVar4 + (long)local_14);
    Jupiter::Config::set(uVar3,local_48._M_len,local_48._M_str,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return;
}

Assistant:

void addNoob(const RenX::PlayerInfo &player, int amount) {
	if (!jessilib::starts_withi(player.uuid, "Player"sv) && !player.isBot) {
		player.varData[pluginInstance.getName()].set("Noobs"sv,static_cast<std::string>(string_printf("%u", getNoobs(player) + amount)));
	}
}